

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetValueAndTemplateStringAndArena::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  bool bVar5;
  int iVar6;
  char *__s1;
  SetProxy SVar7;
  char local_658 [8];
  char expected [256];
  string dump;
  TemplateString local_538;
  TemplateString local_518;
  TemplateString local_4f8;
  TemplateString local_4d8;
  TemplateDictionaryPeer local_4b8;
  TemplateDictionaryPeer peer;
  SetProxy local_490;
  TemplateString local_480;
  SetProxy local_460;
  TemplateString local_450;
  SetProxy local_430;
  allocator local_419;
  string local_418 [32];
  str_ref local_3f8;
  allocator local_3e1;
  string local_3e0 [32];
  TemplateString local_3c0;
  SetProxy local_3a0;
  TemplateString local_390;
  str_ref local_370;
  TemplateString local_360;
  SetProxy local_340;
  str_ref local_330;
  TemplateString local_320;
  allocator local_2f9;
  string local_2f8 [32];
  TemplateString local_2d8;
  TemplateString local_2b8;
  TemplateString local_298;
  allocator local_261;
  string local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  TemplateString local_220;
  TemplateDictionary local_200 [8];
  TemplateDictionary dict;
  uint local_18c;
  UnsafeArena **ppUStack_188;
  int i;
  UnsafeArena *arenas [3];
  UnsafeArena arena;
  
  ctemplate::UnsafeArena::UnsafeArena((UnsafeArena *)(arenas + 2),100);
  ppUStack_188 = arenas + 2;
  arenas[0] = (UnsafeArena *)(arenas + 2);
  arenas[1] = (UnsafeArena *)0x0;
  local_18c = 0;
  while( true ) {
    if (2 < local_18c) {
      ctemplate::UnsafeArena::~UnsafeArena((UnsafeArena *)(arenas + 2));
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"test_arena",&local_261);
    std::operator+(local_240,(char)local_260);
    ctemplate::TemplateString::TemplateString(&local_220,local_240);
    ctemplate::TemplateDictionary::TemplateDictionary
              (local_200,&local_220,
               *(UnsafeArena **)((long)&stack0xfffffffffffffe78 + (long)(int)local_18c * 8));
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    ctemplate::TemplateString::TemplateString(&local_298,"FOO");
    ctemplate::TemplateString::TemplateString(&local_2b8,"foo");
    TVar1.length_ = local_298.length_;
    TVar1.ptr_ = local_298.ptr_;
    TVar1.is_immutable_ = local_298.is_immutable_;
    TVar1._17_7_ = local_298._17_7_;
    TVar1.id_ = local_298.id_;
    TVar3.length_ = local_2b8.length_;
    TVar3.ptr_ = local_2b8.ptr_;
    TVar3.is_immutable_ = local_2b8.is_immutable_;
    TVar3._17_7_ = local_2b8._17_7_;
    TVar3.id_ = local_2b8.id_;
    ctemplate::TemplateDictionary::SetValue(TVar1,TVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f8,"FOO2",&local_2f9);
    ctemplate::TemplateString::TemplateString(&local_2d8,(string *)local_2f8);
    ctemplate::TemplateString::TemplateString(&local_320,"foo2andmore",4);
    TVar2.length_ = local_2d8.length_;
    TVar2.ptr_ = local_2d8.ptr_;
    TVar2.is_immutable_ = local_2d8.is_immutable_;
    TVar2._17_7_ = local_2d8._17_7_;
    TVar2.id_ = local_2d8.id_;
    TVar4.length_ = local_320.length_;
    TVar4.ptr_ = local_320.ptr_;
    TVar4.is_immutable_ = local_320.is_immutable_;
    TVar4._17_7_ = local_320._17_7_;
    TVar4.id_ = local_320.id_;
    ctemplate::TemplateDictionary::SetValue(TVar2,TVar4);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    ctemplate::str_ref_basic<const_char_*>::str_ref_basic(&local_330,"foo3");
    ctemplate::TemplateString::TemplateString(&local_360,"FOO3");
    SVar7 = ctemplate::TemplateDictionary::operator[](local_200,&local_360);
    local_340 = SVar7;
    ctemplate::TemplateDictionary::SetProxy::operator=(&local_340,local_330);
    ctemplate::TemplateString::TemplateString(&local_390,"foo4andmore",4);
    ctemplate::str_ref_basic<const_char_*>::str_ref_basic<ctemplate::TemplateString>
              (&local_370,&local_390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"FOO4",&local_3e1);
    ctemplate::TemplateString::TemplateString(&local_3c0,(string *)local_3e0);
    SVar7 = ctemplate::TemplateDictionary::operator[](local_200,&local_3c0);
    local_3a0 = SVar7;
    ctemplate::TemplateDictionary::SetProxy::operator=(&local_3a0,local_370);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,"Olaf",&local_419);
    ctemplate::str_ref_basic<char_const*>::str_ref_basic<std::__cxx11::string>
              ((str_ref_basic<char_const*> *)&local_3f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418);
    ctemplate::TemplateString::TemplateString(&local_450,"FOO5");
    SVar7 = ctemplate::TemplateDictionary::operator[](local_200,&local_450);
    local_430 = SVar7;
    ctemplate::TemplateDictionary::SetProxy::operator=(&local_430,local_3f8);
    std::__cxx11::string::~string(local_418);
    std::allocator<char>::~allocator((allocator<char> *)&local_419);
    ctemplate::TemplateString::TemplateString(&local_480,"FOO6");
    SVar7 = ctemplate::TemplateDictionary::operator[](local_200,&local_480);
    local_460 = SVar7;
    ctemplate::TemplateDictionary::SetProxy::operator=(&local_460,6);
    ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"FOO7");
    SVar7 = ctemplate::TemplateDictionary::operator[](local_200,(TemplateString *)&peer);
    local_490 = SVar7;
    ctemplate::TemplateDictionary::SetProxy::operator=(&local_490,7);
    ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_4b8,local_200);
    ctemplate::TemplateString::TemplateString(&local_4d8,"FOO");
    ctemplate::TemplateString::TemplateString(&local_4f8,"foo");
    bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_4b8,&local_4d8,&local_4f8);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"FOO\", \"foo\")");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_518,"FOO2");
    ctemplate::TemplateString::TemplateString(&local_538,"foo2");
    bVar5 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_4b8,&local_518,&local_538);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"FOO2\", \"foo2\")");
      exit(1);
    }
    std::__cxx11::string::string((string *)(expected + 0xf8));
    ctemplate::TemplateDictionary::DumpToString
              ((string *)local_200,(int)(string *)(expected + 0xf8));
    snprintf(local_658,0x100,
             "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_arena%d\' {\n   FOO: >foo<\n   FOO2: >foo2<\n   FOO3: >foo3<\n   FOO4: >foo4<\n   FOO5: >Olaf<\n   FOO6: >6<\n   FOO7: >7<\n}\n"
             ,(ulong)local_18c);
    __s1 = (char *)std::__cxx11::string::c_str();
    iVar6 = strcmp(__s1,local_658);
    if (iVar6 != 0) break;
    std::__cxx11::string::~string((string *)(expected + 0xf8));
    ctemplate::TemplateDictionary::~TemplateDictionary(local_200);
    local_18c = local_18c + 1;
  }
  fprintf(_stderr,"Check failed: %s\n","strcmp(dump.c_str(), expected) == 0");
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetValueAndTemplateStringAndArena) {
  // Try both with the arena, and without.
  UnsafeArena arena(100);
  // We run the test with arena twice to double-check we don't ever delete it
  UnsafeArena* arenas[] = {&arena, &arena, NULL};
  for (int i = 0; i < sizeof(arenas)/sizeof(*arenas); ++i) {
    TemplateDictionary dict(string("test_arena") + char('0'+i), arenas[i]);

    // Test copying char*s, strings, and explicit TemplateStrings
    dict.SetValue("FOO", "foo");
    dict.SetValue(string("FOO2"), TemplateString("foo2andmore", 4));
		dict["FOO3"] = "foo3";
		dict[string("FOO4")] = TemplateString("foo4andmore", 4);
		dict["FOO5"] = string("Olaf");
		dict["FOO6"] = 6;
		dict["FOO7"] = long(7);

    TemplateDictionaryPeer peer(&dict);
    // verify what happened
    EXPECT_TRUE(peer.ValueIs("FOO", "foo"));
    EXPECT_TRUE(peer.ValueIs("FOO2", "foo2"));
    string dump;
    dict.DumpToString(&dump);
    char expected[256];
    snprintf(expected, sizeof(expected),
             ("global dictionary {\n"
              "   BI_NEWLINE: >\n"
              "<\n"
              "   BI_SPACE: > <\n"
              "   GLOBAL: >top<\n"
              "};\n"
              "dictionary 'test_arena%d' {\n"
              "   FOO: >foo<\n"
              "   FOO2: >foo2<\n"
              "   FOO3: >foo3<\n"
              "   FOO4: >foo4<\n"
              "   FOO5: >Olaf<\n"
              "   FOO6: >6<\n"
              "   FOO7: >7<\n"
              "}\n"), i);
    EXPECT_STREQ(dump.c_str(), expected);
  }
}